

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O0

void __thiscall BufferedReaderManager::~BufferedReaderManager(BufferedReaderManager *this)

{
  bool bVar1;
  reference ppBVar2;
  BufferedReader **m_fileReader;
  iterator __end1;
  iterator __begin1;
  vector<BufferedReader_*,_std::allocator<BufferedReader_*>_> *__range1;
  BufferedReaderManager *this_local;
  
  __end1 = std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::begin
                     (&this->m_fileReaders);
  m_fileReader = (BufferedReader **)
                 std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::end
                           (&this->m_fileReaders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BufferedReader_**,_std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>_>
                                *)&m_fileReader);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<BufferedReader_**,_std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>_>
              ::operator*(&__end1);
    if (*ppBVar2 != (BufferedReader *)0x0) {
      (*((*ppBVar2)->super_AbstractReader)._vptr_AbstractReader[1])();
    }
    __gnu_cxx::
    __normal_iterator<BufferedReader_**,_std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::~vector(&this->m_fileReaders);
  return;
}

Assistant:

BufferedReaderManager::~BufferedReaderManager()
{
    for (const auto& m_fileReader : m_fileReaders)
    {
        delete m_fileReader;  // need to define destruction order first. This object MUST be deleted after
                              // MCVodStreamer
    }
}